

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

bool QObject::disconnectImpl
               (QObject *sender,void **signal,QObject *receiver,void **slot,
               QMetaObject *senderMetaObject)

{
  QMetaObject *pQVar1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  int signal_index;
  int local_4c;
  int *local_48;
  void **local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((sender == (QObject *)0x0) || (slot != (void **)0x0 && receiver == (QObject *)0x0)) {
    lcConnect();
    if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      disconnectImpl();
    }
  }
  else {
    local_4c = -1;
    if (signal == (void **)0x0) {
LAB_002b7b83:
      bVar2 = QMetaObjectPrivate::disconnect
                        (sender,local_4c,senderMetaObject,receiver,-1,slot,DisconnectAll);
      goto LAB_002b7ab9;
    }
    local_48 = &local_4c;
    local_40 = signal;
    if (senderMetaObject != (QMetaObject *)0x0) {
      do {
        QMetaObject::static_metacall(senderMetaObject,IndexOfMethod,0,&local_48);
        if (-1 < local_4c) {
          if ((local_4c < (int)(senderMetaObject->d).data[0xd]) ||
             (senderMetaObject = (senderMetaObject->d).superdata.direct,
             senderMetaObject != (QMetaObject *)0x0)) {
            iVar3 = 0;
            for (pQVar1 = (senderMetaObject->d).superdata.direct; pQVar1 != (QMetaObject *)0x0;
                pQVar1 = (pQVar1->d).superdata.direct) {
              iVar3 = iVar3 + (pQVar1->d).data[0xd];
            }
            local_4c = local_4c + iVar3;
            goto LAB_002b7b83;
          }
          break;
        }
        senderMetaObject = (senderMetaObject->d).superdata.direct;
      } while (senderMetaObject != (QMetaObject *)0x0);
    }
    lcConnect();
    if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      disconnectImpl(sender);
    }
  }
  bVar2 = false;
LAB_002b7ab9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QObject::disconnectImpl(const QObject *sender, void **signal, const QObject *receiver, void **slot, const QMetaObject *senderMetaObject)
{
    if (sender == nullptr || (receiver == nullptr && slot != nullptr)) {
        qCWarning(lcConnect, "QObject::disconnect: Unexpected nullptr parameter");
        return false;
    }

    int signal_index = -1;
    if (signal) {
        void *args[] = { &signal_index, signal };
        for (; senderMetaObject && signal_index < 0; senderMetaObject = senderMetaObject->superClass()) {
            senderMetaObject->static_metacall(QMetaObject::IndexOfMethod, 0, args);
            if (signal_index >= 0 && signal_index < QMetaObjectPrivate::get(senderMetaObject)->signalCount)
                break;
        }
        if (!senderMetaObject) {
            qCWarning(lcConnect, "QObject::disconnect: signal not found in %s", sender->metaObject()->className());
            return false;
        }
        signal_index += QMetaObjectPrivate::signalOffset(senderMetaObject);
    }

    return QMetaObjectPrivate::disconnect(sender, signal_index, senderMetaObject, receiver, -1, slot);
}